

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct64_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i alVar8;
  undefined1 auVar9 [32];
  undefined1 *puVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  __m256i cospi32;
  __m256i cospim32;
  __m256i cospim48;
  __m256i cospim16;
  __m256i cospi48;
  __m256i cospi16;
  __m256i clamp_hi;
  __m256i clamp_lo;
  __m256i rnding;
  undefined1 local_d40 [32];
  int local_c80;
  int iStack_c7c;
  int iStack_c78;
  int iStack_c74;
  int iStack_c70;
  int iStack_c6c;
  int iStack_c68;
  int iStack_c64;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [16];
  undefined1 auStack_bd0 [16];
  undefined1 local_bc0 [32];
  int local_ba0;
  int iStack_b9c;
  int iStack_b98;
  int iStack_b94;
  int iStack_b90;
  int iStack_b8c;
  int iStack_b88;
  int iStack_b84;
  int local_b80;
  int iStack_b7c;
  int iStack_b78;
  int iStack_b74;
  int iStack_b70;
  int iStack_b6c;
  int iStack_b68;
  int iStack_b64;
  int local_b60;
  int iStack_b5c;
  int iStack_b58;
  int iStack_b54;
  int iStack_b50;
  int iStack_b4c;
  int iStack_b48;
  int iStack_b44;
  int local_b40;
  int iStack_b3c;
  int iStack_b38;
  int iStack_b34;
  int iStack_b30;
  int iStack_b2c;
  int iStack_b28;
  int iStack_b24;
  int local_b20;
  int iStack_b1c;
  int iStack_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  int iStack_b08;
  int iStack_b04;
  int local_b00;
  int iStack_afc;
  int iStack_af8;
  int iStack_af4;
  int iStack_af0;
  int iStack_aec;
  int iStack_ae8;
  int iStack_ae4;
  int local_ae0;
  int iStack_adc;
  int iStack_ad8;
  int iStack_ad4;
  int iStack_ad0;
  int iStack_acc;
  int iStack_ac8;
  int iStack_ac4;
  int local_ac0;
  int iStack_abc;
  int iStack_ab8;
  int iStack_ab4;
  int iStack_ab0;
  int iStack_aac;
  int iStack_aa8;
  int iStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  __m256i local_860;
  __m256i local_840;
  __m256i local_820;
  __m256i local_800;
  longlong local_7e0;
  longlong lStack_7d8;
  longlong lStack_7d0;
  longlong lStack_7c8;
  longlong local_7c0;
  longlong lStack_7b8;
  longlong lStack_7b0;
  longlong lStack_7a8;
  longlong local_7a0;
  longlong lStack_798;
  longlong lStack_790;
  longlong lStack_788;
  longlong local_780;
  longlong lStack_778;
  longlong lStack_770;
  longlong lStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  lVar14 = (long)bit;
  lVar15 = lVar14 * 0x100;
  local_ac0 = 1 << ((char)bit - 1U & 0x1f);
  iVar18 = bd + (uint)(do_cols == 0) * 2;
  local_b00 = 0x8000;
  if (0xf < iVar18 + 6) {
    local_b00 = 1 << ((char)iVar18 + 5U & 0x1f);
  }
  local_ae0 = -local_b00;
  local_b00 = local_b00 + -1;
  iVar18 = LoadMaskz2[lVar14 * 8 + 2][1];
  auVar35._4_4_ = iVar18;
  auVar35._0_4_ = iVar18;
  auVar35._8_4_ = iVar18;
  auVar35._12_4_ = iVar18;
  auVar35._16_4_ = iVar18;
  auVar35._20_4_ = iVar18;
  auVar35._24_4_ = iVar18;
  auVar35._28_4_ = iVar18;
  iVar18 = LoadMaskz2[lVar14 * 8 + 2][2];
  auVar28._4_4_ = iVar18;
  auVar28._0_4_ = iVar18;
  auVar28._8_4_ = iVar18;
  auVar28._12_4_ = iVar18;
  auVar28._16_4_ = iVar18;
  auVar28._20_4_ = iVar18;
  auVar28._24_4_ = iVar18;
  auVar28._28_4_ = iVar18;
  iVar18 = LoadMaskz2[lVar14 * 8 + 2][3];
  auVar32._4_4_ = iVar18;
  auVar32._0_4_ = iVar18;
  auVar32._8_4_ = iVar18;
  auVar32._12_4_ = iVar18;
  auVar32._16_4_ = iVar18;
  auVar32._20_4_ = iVar18;
  auVar32._24_4_ = iVar18;
  auVar32._28_4_ = iVar18;
  iVar12 = LoadMaskz2[lVar14 * 8 + 2][4];
  local_d40._4_4_ = LoadMaskz2[lVar14 * 8 + 2][6];
  local_d40._0_4_ = local_d40._4_4_;
  local_d40._8_4_ = local_d40._4_4_;
  local_d40._12_4_ = local_d40._4_4_;
  local_d40._16_4_ = local_d40._4_4_;
  local_d40._20_4_ = local_d40._4_4_;
  local_d40._24_4_ = local_d40._4_4_;
  local_d40._28_4_ = local_d40._4_4_;
  local_b20 = LoadMaskz2[lVar14 * 8 + 4][0];
  local_b60 = -local_b20;
  local_c80 = LoadMaskz2[lVar14 * 8 + 6][0];
  local_ba0 = -local_c80;
  local_b40 = *(int *)(&DAT_00b995e0 + lVar14 * 0x20);
  iVar11 = -iVar12;
  local_b80 = -local_b40;
  iVar18 = -*(int *)((long)&DAT_00b99600 + lVar15 + 4);
  iVar17 = -*(int *)(&DAT_00b99614 + lVar15);
  uVar1 = *(undefined4 *)(&DAT_00b9961c + lVar15);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar39._16_4_ = uVar1;
  auVar39._20_4_ = uVar1;
  auVar39._24_4_ = uVar1;
  auVar39._28_4_ = uVar1;
  auVar44._4_4_ = iVar18;
  auVar44._0_4_ = iVar18;
  auVar44._8_4_ = iVar18;
  auVar44._12_4_ = iVar18;
  auVar44._16_4_ = iVar18;
  auVar44._20_4_ = iVar18;
  auVar44._24_4_ = iVar18;
  auVar44._28_4_ = iVar18;
  iVar18 = LoadMaskz2[lVar14 * 8 + 2][7];
  auVar20._4_4_ = iVar18;
  auVar20._0_4_ = iVar18;
  auVar20._8_4_ = iVar18;
  auVar20._12_4_ = iVar18;
  auVar20._16_4_ = iVar18;
  auVar20._20_4_ = iVar18;
  auVar20._24_4_ = iVar18;
  auVar20._28_4_ = iVar18;
  iVar18 = LoadMaskz2[lVar14 * 8 + 2][5];
  auVar21._4_4_ = iVar18;
  auVar21._0_4_ = iVar18;
  auVar21._8_4_ = iVar18;
  auVar21._12_4_ = iVar18;
  auVar21._16_4_ = iVar18;
  auVar21._20_4_ = iVar18;
  auVar21._24_4_ = iVar18;
  auVar21._28_4_ = iVar18;
  uVar1 = *(undefined4 *)((long)&DAT_00b99608 + lVar15 + 4);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  iVar18 = -*(int *)(&DAT_00b99608 + lVar14 * 0x20);
  auVar19._4_4_ = iVar17;
  auVar19._0_4_ = iVar17;
  auVar19._8_4_ = iVar17;
  auVar19._12_4_ = iVar17;
  auVar19._16_4_ = iVar17;
  auVar19._20_4_ = iVar17;
  auVar19._24_4_ = iVar17;
  auVar19._28_4_ = iVar17;
  uVar1 = *(undefined4 *)(&DAT_00b99618 + lVar15);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  auVar42._4_4_ = iVar18;
  auVar42._0_4_ = iVar18;
  auVar42._8_4_ = iVar18;
  auVar42._12_4_ = iVar18;
  auVar42._16_4_ = iVar18;
  auVar42._20_4_ = iVar18;
  auVar42._24_4_ = iVar18;
  auVar42._28_4_ = iVar18;
  puVar10 = local_460;
  auVar3 = vpmulld_avx2(auVar35,(undefined1  [32])in[1]);
  auVar4 = vpmulld_avx2(auVar39,(undefined1  [32])in[1]);
  auVar5 = vpmulld_avx2(auVar44,(undefined1  [32])in[7]);
  auVar6 = vpmulld_avx2(auVar20,(undefined1  [32])in[7]);
  auVar7 = vpmulld_avx2(auVar21,(undefined1  [32])in[5]);
  auVar20 = vpmulld_avx2(auVar40,(undefined1  [32])in[5]);
  auVar19 = vpmulld_avx2(auVar19,(undefined1  [32])in[3]);
  auVar21 = vpmulld_avx2(auVar32,(undefined1  [32])in[3]);
  auVar28 = vpmulld_avx2(auVar28,(undefined1  [32])in[2]);
  auVar32 = vpmulld_avx2(auVar45,(undefined1  [32])in[2]);
  auVar9._4_4_ = local_ac0;
  auVar9._0_4_ = local_ac0;
  auVar9._8_4_ = local_ac0;
  auVar9._12_4_ = local_ac0;
  auVar9._16_4_ = local_ac0;
  auVar9._20_4_ = local_ac0;
  auVar9._24_4_ = local_ac0;
  auVar9._28_4_ = local_ac0;
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  local_880 = vpsrad_avx2(auVar3,ZEXT416((uint)bit));
  auVar35 = vpmulld_avx2(auVar42,(undefined1  [32])in[6]);
  auVar24 = vpmulld_avx2((undefined1  [32])in[6],local_d40);
  auVar3 = vpaddd_avx2(auVar4,auVar9);
  local_8a0 = vpsrad_avx2(auVar3,ZEXT416((uint)bit));
  auVar22._4_4_ = iVar11;
  auVar22._0_4_ = iVar11;
  auVar22._8_4_ = iVar11;
  auVar22._12_4_ = iVar11;
  auVar22._16_4_ = iVar11;
  auVar22._20_4_ = iVar11;
  auVar22._24_4_ = iVar11;
  auVar22._28_4_ = iVar11;
  auVar3 = vpmulld_avx2(local_8a0,auVar22);
  uVar1 = *(undefined4 *)(&DAT_00b99610 + lVar15);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  auVar46._16_4_ = uVar1;
  auVar46._20_4_ = uVar1;
  auVar46._24_4_ = uVar1;
  auVar46._28_4_ = uVar1;
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar4 = vpmulld_avx2(local_880,auVar46);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  auVar23._4_4_ = iVar12;
  auVar23._0_4_ = iVar12;
  auVar23._8_4_ = iVar12;
  auVar23._12_4_ = iVar12;
  auVar23._16_4_ = iVar12;
  auVar23._20_4_ = iVar12;
  auVar23._24_4_ = iVar12;
  auVar23._28_4_ = iVar12;
  local_80 = local_880;
  auVar4 = vpaddd_avx2(auVar5,auVar9);
  auVar41 = ZEXT416((uint)bit);
  local_8c0 = vpsrad_avx2(auVar4,auVar41);
  local_460 = local_8a0;
  auVar4 = vpaddd_avx2(auVar6,auVar9);
  local_8e0 = vpsrad_avx2(auVar4,auVar41);
  local_380 = local_8c0;
  auVar4 = vpaddd_avx2(auVar9,auVar7);
  local_9a0 = vpsrad_avx2(auVar4,auVar41);
  local_160 = local_8e0;
  auVar4 = vpaddd_avx2(auVar9,auVar20);
  local_9c0 = vpsrad_avx2(auVar4,auVar41);
  local_180 = local_9a0;
  auVar4 = vpaddd_avx2(auVar9,auVar19);
  auVar41 = ZEXT416((uint)bit);
  local_a60 = vpsrad_avx2(auVar4,auVar41);
  local_360 = local_9c0;
  auVar4 = vpaddd_avx2(auVar21,auVar9);
  local_a40 = vpsrad_avx2(auVar4,auVar41);
  local_280 = local_a60;
  auVar4 = vpaddd_avx2(auVar28,auVar9);
  local_480 = vpsrad_avx2(auVar4,auVar41);
  local_260 = local_a40;
  auVar4 = vpaddd_avx2(auVar9,auVar32);
  local_660 = vpsrad_avx2(auVar4,auVar41);
  auVar4 = vpaddd_avx2(auVar9,auVar35);
  local_580 = vpsrad_avx2(auVar4,auVar41);
  auVar4 = vpaddd_avx2(auVar9,auVar24);
  local_560 = vpsrad_avx2(auVar4,auVar41);
  auVar28 = vpmulld_avx2((undefined1  [32])in[4],auVar23);
  auVar35 = vpmulld_avx2((undefined1  [32])in[4],auVar46);
  auVar4 = vpmulld_avx2(local_8a0,auVar46);
  auVar5 = vpmulld_avx2(local_880,auVar23);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  iVar18 = LoadMaskz2[lVar14 * 8 + 5][4];
  auVar24._4_4_ = iVar18;
  auVar24._0_4_ = iVar18;
  auVar24._8_4_ = iVar18;
  auVar24._12_4_ = iVar18;
  auVar24._16_4_ = iVar18;
  auVar24._20_4_ = iVar18;
  auVar24._24_4_ = iVar18;
  auVar24._28_4_ = iVar18;
  iVar12 = -LoadMaskz2[lVar14 * 8 + 6][4];
  auVar29._4_4_ = iVar12;
  auVar29._0_4_ = iVar12;
  auVar29._8_4_ = iVar12;
  auVar29._12_4_ = iVar12;
  auVar29._16_4_ = iVar12;
  auVar29._20_4_ = iVar12;
  auVar29._24_4_ = iVar12;
  auVar29._28_4_ = iVar12;
  auVar5 = vpmulld_avx2(local_8e0,auVar24);
  auVar5 = vpaddd_avx2(auVar9,auVar5);
  auVar6 = vpmulld_avx2(local_8c0,auVar29);
  auVar5 = vpaddd_avx2(auVar6,auVar5);
  iVar18 = -iVar18;
  auVar25._4_4_ = iVar18;
  auVar25._0_4_ = iVar18;
  auVar25._8_4_ = iVar18;
  auVar25._12_4_ = iVar18;
  auVar25._16_4_ = iVar18;
  auVar25._20_4_ = iVar18;
  auVar25._24_4_ = iVar18;
  auVar25._28_4_ = iVar18;
  auVar7 = vpmulld_avx2(local_8c0,auVar25);
  auVar6 = vpmulld_avx2(local_8e0,auVar29);
  auVar6 = vpaddd_avx2(auVar9,auVar6);
  local_9e0 = vpaddd_avx2(auVar7,auVar6);
  iVar12 = LoadMaskz2[lVar14 * 8 + 4][4];
  iVar18 = -iVar12;
  auVar30._4_4_ = iVar18;
  auVar30._0_4_ = iVar18;
  auVar30._8_4_ = iVar18;
  auVar30._12_4_ = iVar18;
  auVar30._16_4_ = iVar18;
  auVar30._20_4_ = iVar18;
  auVar30._24_4_ = iVar18;
  auVar30._28_4_ = iVar18;
  auVar6 = vpmulld_avx2(local_9c0,auVar30);
  iVar18 = LoadMaskz2[lVar14 * 8 + 7][4];
  auVar33._4_4_ = iVar18;
  auVar33._0_4_ = iVar18;
  auVar33._8_4_ = iVar18;
  auVar33._12_4_ = iVar18;
  auVar33._16_4_ = iVar18;
  auVar33._20_4_ = iVar18;
  auVar33._24_4_ = iVar18;
  auVar33._28_4_ = iVar18;
  auVar6 = vpaddd_avx2(auVar6,auVar9);
  auVar7 = vpmulld_avx2(local_9a0,auVar33);
  local_a00 = vpaddd_avx2(auVar6,auVar7);
  auVar26._4_4_ = iVar12;
  auVar26._0_4_ = iVar12;
  auVar26._8_4_ = iVar12;
  auVar26._12_4_ = iVar12;
  auVar26._16_4_ = iVar12;
  auVar26._20_4_ = iVar12;
  auVar26._24_4_ = iVar12;
  auVar26._28_4_ = iVar12;
  auVar6 = vpmulld_avx2(local_9c0,auVar33);
  auVar7 = vpmulld_avx2(local_9a0,auVar26);
  auVar6 = vpaddd_avx2(auVar6,auVar9);
  local_a20 = vpaddd_avx2(auVar6,auVar7);
  iVar18 = LoadMaskz2[lVar14 * 8 + 3][4];
  iVar12 = -iVar18;
  auVar31._4_4_ = iVar12;
  auVar31._0_4_ = iVar12;
  auVar31._8_4_ = iVar12;
  auVar31._12_4_ = iVar12;
  auVar31._16_4_ = iVar12;
  auVar31._20_4_ = iVar12;
  auVar31._24_4_ = iVar12;
  auVar31._28_4_ = iVar12;
  iVar12 = -*(int *)(&DAT_00b995f0 + lVar14 * 0x20);
  auVar34._4_4_ = iVar12;
  auVar34._0_4_ = iVar12;
  auVar34._8_4_ = iVar12;
  auVar34._12_4_ = iVar12;
  auVar34._16_4_ = iVar12;
  auVar34._20_4_ = iVar12;
  auVar34._24_4_ = iVar12;
  auVar34._28_4_ = iVar12;
  auVar7 = vpmulld_avx2(local_a60,auVar31);
  auVar6 = vpmulld_avx2(local_a40,auVar34);
  auVar6 = vpaddd_avx2(auVar9,auVar6);
  local_a80 = vpaddd_avx2(auVar7,auVar6);
  auVar27._4_4_ = iVar18;
  auVar27._0_4_ = iVar18;
  auVar27._8_4_ = iVar18;
  auVar27._12_4_ = iVar18;
  auVar27._16_4_ = iVar18;
  auVar27._20_4_ = iVar18;
  auVar27._24_4_ = iVar18;
  auVar27._28_4_ = iVar18;
  auVar7 = vpmulld_avx2(local_a60,auVar34);
  auVar6 = vpmulld_avx2(local_a40,auVar27);
  auVar6 = vpaddd_avx2(auVar9,auVar6);
  auVar6 = vpaddd_avx2(auVar7,auVar6);
  iVar18 = LoadMaskz2[lVar14 * 8 + 3][0];
  iVar12 = *(int *)(&DAT_00b99600 + lVar14 * 0x20);
  auVar36._4_4_ = iVar12;
  auVar36._0_4_ = iVar12;
  auVar36._8_4_ = iVar12;
  auVar36._12_4_ = iVar12;
  auVar36._16_4_ = iVar12;
  auVar36._20_4_ = iVar12;
  auVar36._24_4_ = iVar12;
  auVar36._28_4_ = iVar12;
  iVar17 = -iVar18;
  auVar43._4_4_ = iVar17;
  auVar43._0_4_ = iVar17;
  auVar43._8_4_ = iVar17;
  auVar43._12_4_ = iVar17;
  auVar43._16_4_ = iVar17;
  auVar43._20_4_ = iVar17;
  auVar43._24_4_ = iVar17;
  auVar43._28_4_ = iVar17;
  auVar7 = vpmulld_avx2(local_660,auVar43);
  auVar7 = vpaddd_avx2(auVar7,auVar9);
  auVar20 = vpmulld_avx2(local_480,auVar36);
  auVar7 = vpaddd_avx2(auVar7,auVar20);
  local_980._4_4_ = iVar18;
  local_980._0_4_ = iVar18;
  local_980._8_4_ = iVar18;
  local_980._12_4_ = iVar18;
  local_980._16_4_ = iVar18;
  local_980._20_4_ = iVar18;
  local_980._24_4_ = iVar18;
  local_980._28_4_ = iVar18;
  auVar20 = vpmulld_avx2(local_660,auVar36);
  auVar20 = vpaddd_avx2(auVar20,auVar9);
  auVar19 = vpmulld_avx2(local_480,local_980);
  auVar20 = vpaddd_avx2(auVar20,auVar19);
  iVar18 = LoadMaskz2[lVar14 * 8 + 5][0];
  uVar2 = LoadMaskz2[lVar14 * 8 + 7][0];
  iVar17 = -iVar18;
  local_bc0._4_4_ = iVar17;
  local_bc0._0_4_ = iVar17;
  local_bc0._8_4_ = iVar17;
  local_bc0._12_4_ = iVar17;
  local_bc0._16_4_ = iVar17;
  local_bc0._20_4_ = iVar17;
  local_bc0._24_4_ = iVar17;
  local_bc0._28_4_ = iVar17;
  auStack_bd0 = auVar32._16_16_;
  local_be0 = ZEXT416(uVar2);
  iVar17 = -uVar2;
  local_920._4_4_ = iVar17;
  local_920._0_4_ = iVar17;
  local_920._8_4_ = iVar17;
  local_920._12_4_ = iVar17;
  local_920._16_4_ = iVar17;
  local_920._20_4_ = iVar17;
  local_920._24_4_ = iVar17;
  local_920._28_4_ = iVar17;
  auVar19 = vpmulld_avx2(local_560,local_920);
  auVar19 = vpaddd_avx2(auVar9,auVar19);
  auVar21 = vpmulld_avx2(local_580,local_bc0);
  auVar19 = vpaddd_avx2(auVar21,auVar19);
  local_900._4_4_ = iVar18;
  local_900._0_4_ = iVar18;
  local_900._8_4_ = iVar18;
  local_900._12_4_ = iVar18;
  local_900._16_4_ = iVar18;
  local_900._20_4_ = iVar18;
  local_900._24_4_ = iVar18;
  local_900._28_4_ = iVar18;
  auVar21 = vpmulld_avx2(local_560,local_900);
  auVar21 = vpaddd_avx2(auVar9,auVar21);
  auVar32 = vpmulld_avx2(local_580,local_920);
  local_aa0 = vpaddd_avx2(auVar32,auVar21);
  auVar21 = vpaddd_avx2(auVar9,auVar28);
  local_940 = vpsrad_avx2(auVar21,auVar41);
  local_680 = local_940;
  auVar21 = vpaddd_avx2(auVar9,auVar35);
  local_c40 = vpsrad_avx2(auVar21,auVar41);
  auVar41 = ZEXT416((uint)bit);
  local_440 = vpsrad_avx2(auVar3,auVar41);
  local_760 = local_c40;
  local_a0 = vpsrad_avx2(auVar4,auVar41);
  local_960 = vpsrad_avx2(auVar5,auVar41);
  local_3a0 = vpsrad_avx2(local_9e0,auVar41);
  local_340 = vpsrad_avx2(local_a00,auVar41);
  local_140 = local_960;
  local_c60 = vpsrad_avx2(local_a20,auVar41);
  local_1a0 = local_c60;
  local_2a0 = vpsrad_avx2(local_a80,auVar41);
  local_240 = vpsrad_avx2(auVar6,auVar41);
  local_640 = vpsrad_avx2(auVar7,auVar41);
  local_4a0 = vpsrad_avx2(auVar20,auVar41);
  local_5a0 = vpsrad_avx2(auVar19,auVar41);
  local_540 = vpsrad_avx2(local_aa0,auVar41);
  local_c00._4_4_ = local_b60;
  local_c00._0_4_ = local_b60;
  local_c00._8_4_ = local_b60;
  local_c00._12_4_ = local_b60;
  local_c00._16_4_ = local_b60;
  local_c00._20_4_ = local_b60;
  local_c00._24_4_ = local_b60;
  local_c00._28_4_ = local_b60;
  auVar3 = vpmulld_avx2(local_c40,local_c00);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar7._4_4_ = local_b40;
  auVar7._0_4_ = local_b40;
  auVar7._8_4_ = local_b40;
  auVar7._12_4_ = local_b40;
  auVar7._16_4_ = local_b40;
  auVar7._20_4_ = local_b40;
  auVar7._24_4_ = local_b40;
  auVar7._28_4_ = local_b40;
  auVar4 = vpmulld_avx2(local_940,auVar7);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4._4_4_ = local_c80;
  auVar4._0_4_ = local_c80;
  auVar4._8_4_ = local_c80;
  auVar4._12_4_ = local_c80;
  auVar4._16_4_ = local_c80;
  auVar4._20_4_ = local_c80;
  auVar4._24_4_ = local_c80;
  auVar4._28_4_ = local_c80;
  auVar5 = vpmulld_avx2((undefined1  [32])*in,auVar4);
  auVar4 = vpmulld_avx2(auVar7,local_c40);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  local_c20._4_4_ = local_b20;
  local_c20._0_4_ = local_b20;
  local_c20._8_4_ = local_b20;
  local_c20._12_4_ = local_b20;
  local_c20._16_4_ = local_b20;
  local_c20._20_4_ = local_b20;
  local_c20._24_4_ = local_b20;
  local_c20._28_4_ = local_b20;
  auVar6 = vpmulld_avx2(local_c20,local_940);
  auVar4 = vpaddd_avx2(auVar6,auVar4);
  auVar5 = vpaddd_avx2(auVar5,auVar9);
  alVar8 = (__m256i)vpsrad_avx2(auVar5,auVar41);
  local_840[0] = alVar8[0];
  local_840[1] = alVar8[1];
  local_840[2] = alVar8[2];
  local_840[3] = alVar8[3];
  local_860[0] = alVar8[0];
  local_860[1] = alVar8[1];
  local_860[2] = alVar8[2];
  local_860[3] = alVar8[3];
  local_740 = vpsrad_avx2(auVar3,auVar41);
  local_6a0 = vpsrad_avx2(auVar4,auVar41);
  auVar3 = vpmulld_avx2(local_440,auVar43);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar4 = vpmulld_avx2(local_a0,auVar36);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_440,auVar36);
  auVar5 = vpmulld_avx2(local_a0,local_980);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  local_420 = vpsrad_avx2(auVar3,auVar41);
  auVar41 = ZEXT416((uint)bit);
  local_c0 = vpsrad_avx2(auVar4,auVar41);
  auVar3 = vpmulld_avx2(local_8a0,auVar43);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar4 = vpmulld_avx2(local_880,auVar36);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar5 = vpmulld_avx2(local_880,local_980);
  auVar4 = vpmulld_avx2(local_8a0,auVar36);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  local_e0 = vpsrad_avx2(auVar4,auVar41);
  local_400 = vpsrad_avx2(auVar3,auVar41);
  auVar3 = vpmulld_avx2(local_8e0,auVar36);
  auVar3 = vpaddd_avx2(auVar9,auVar3);
  auVar4 = vpmulld_avx2(local_8c0,auVar43);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  iVar12 = -iVar12;
  auVar37._4_4_ = iVar12;
  auVar37._0_4_ = iVar12;
  auVar37._8_4_ = iVar12;
  auVar37._12_4_ = iVar12;
  auVar37._16_4_ = iVar12;
  auVar37._20_4_ = iVar12;
  auVar37._24_4_ = iVar12;
  auVar37._28_4_ = iVar12;
  auVar5 = vpmulld_avx2(local_8c0,auVar37);
  auVar4 = vpmulld_avx2(local_8e0,auVar43);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  local_100 = vpsrad_avx2(auVar3,auVar41);
  auVar3 = vpaddd_avx2(auVar4,auVar5);
  local_3e0 = vpsrad_avx2(auVar3,auVar41);
  auVar3 = vpmulld_avx2(local_3a0,auVar37);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar4 = vpmulld_avx2(local_960,auVar43);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_3a0,auVar43);
  auVar5 = vpmulld_avx2(local_960,auVar36);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  local_120 = vpsrad_avx2(auVar4,auVar41);
  local_3c0 = vpsrad_avx2(auVar3,auVar41);
  auVar3 = vpmulld_avx2(local_340,local_920);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar4 = vpmulld_avx2(local_c60,local_900);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar38._4_4_ = uVar2;
  auVar38._0_4_ = uVar2;
  auVar38._8_4_ = uVar2;
  auVar38._12_4_ = uVar2;
  auVar38._16_4_ = uVar2;
  auVar38._20_4_ = uVar2;
  auVar38._24_4_ = uVar2;
  auVar38._28_4_ = uVar2;
  auVar4 = vpmulld_avx2(local_340,local_900);
  auVar5 = vpmulld_avx2(local_c60,auVar38);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  local_320 = vpsrad_avx2(auVar3,auVar41);
  local_1c0 = vpsrad_avx2(auVar4,auVar41);
  auVar3 = vpmulld_avx2(local_9a0,local_900);
  auVar3 = vpaddd_avx2(auVar9,auVar3);
  auVar4 = vpmulld_avx2(local_9c0,local_920);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  local_300 = vpsrad_avx2(auVar3,auVar41);
  auVar4 = vpmulld_avx2(local_9a0,auVar38);
  auVar3 = vpmulld_avx2(local_9c0,local_900);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_1e0 = vpsrad_avx2(auVar3,auVar41);
  auVar3 = vpmulld_avx2(local_a60,local_bc0);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar4 = vpmulld_avx2(local_a40,local_920);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_2e0 = vpsrad_avx2(auVar3,auVar41);
  auVar4 = vpmulld_avx2(local_a60,local_920);
  auVar3 = vpmulld_avx2(local_a40,local_900);
  auVar3 = vpaddd_avx2(auVar9,auVar3);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  local_200 = vpsrad_avx2(auVar3,auVar41);
  auVar3 = vpmulld_avx2(local_2a0,local_bc0);
  auVar4 = vpmulld_avx2(local_240,local_920);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar5 = vpmulld_avx2(local_2a0,local_920);
  auVar4 = vpmulld_avx2(local_240,local_900);
  auVar4 = vpaddd_avx2(auVar9,auVar4);
  auVar4 = vpaddd_avx2(auVar5,auVar4);
  local_220 = vpsrad_avx2(auVar4,auVar41);
  local_2c0 = vpsrad_avx2(auVar3,auVar41);
  local_800[0] = alVar8[0];
  local_800[1] = alVar8[1];
  local_800[2] = alVar8[2];
  local_800[3] = alVar8[3];
  local_820[0] = alVar8[0];
  local_820[1] = alVar8[1];
  local_820[2] = alVar8[2];
  local_820[3] = alVar8[3];
  local_700 = local_c40._0_8_;
  uStack_6f8 = local_c40._8_8_;
  uStack_6f0 = local_c40._16_8_;
  uStack_6e8 = local_c40._24_8_;
  local_720 = local_740;
  local_6e0 = local_940._0_8_;
  uStack_6d8 = local_940._8_8_;
  uStack_6d0 = local_940._16_8_;
  uStack_6c8 = local_940._24_8_;
  local_6c0 = local_6a0;
  auVar3 = vpmulld_avx2(local_640,local_c00);
  auVar4 = vpmulld_avx2(local_4a0,auVar7);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_620 = vpsrad_avx2(auVar3,auVar41);
  auVar3 = vpmulld_avx2(local_640,auVar7);
  auVar4 = vpmulld_avx2(local_4a0,local_c20);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_4c0 = vpsrad_avx2(auVar3,auVar41);
  auVar3 = vpmulld_avx2(local_660,local_c00);
  auVar4 = vpmulld_avx2(local_480,auVar7);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_600 = vpsrad_avx2(auVar3,auVar41);
  auVar3 = vpmulld_avx2(local_660,auVar7);
  auVar4 = vpmulld_avx2(local_480,local_c20);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_4e0 = vpsrad_avx2(auVar3,auVar41);
  auVar5._4_4_ = local_b80;
  auVar5._0_4_ = local_b80;
  auVar5._8_4_ = local_b80;
  auVar5._12_4_ = local_b80;
  auVar5._16_4_ = local_b80;
  auVar5._20_4_ = local_b80;
  auVar5._24_4_ = local_b80;
  auVar5._28_4_ = local_b80;
  auVar3 = vpmulld_avx2(local_580,auVar5);
  auVar4 = vpmulld_avx2(local_560,local_c00);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_5e0 = vpsrad_avx2(auVar3,auVar41);
  auVar3 = vpmulld_avx2(local_580,local_c00);
  auVar4 = vpmulld_avx2(local_560,auVar7);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_500 = vpsrad_avx2(auVar3,auVar41);
  auVar3 = vpmulld_avx2(local_5a0,auVar5);
  auVar4 = vpmulld_avx2(local_540,local_c00);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_5a0,local_c00);
  auVar5 = vpmulld_avx2(local_540,auVar7);
  auVar4 = vpaddd_avx2(auVar4,auVar9);
  local_5c0 = vpsrad_avx2(auVar3,auVar41);
  auVar3 = vpaddd_avx2(auVar4,auVar5);
  local_520 = vpsrad_avx2(auVar3,auVar41);
  auVar6._4_4_ = local_ae0;
  auVar6._0_4_ = local_ae0;
  auVar6._8_4_ = local_ae0;
  auVar6._12_4_ = local_ae0;
  auVar6._16_4_ = local_ae0;
  auVar6._20_4_ = local_ae0;
  auVar6._24_4_ = local_ae0;
  auVar6._28_4_ = local_ae0;
  auVar3._4_4_ = local_b00;
  auVar3._0_4_ = local_b00;
  auVar3._8_4_ = local_b00;
  auVar3._12_4_ = local_b00;
  auVar3._16_4_ = local_b00;
  auVar3._20_4_ = local_b00;
  auVar3._24_4_ = local_b00;
  auVar3._28_4_ = local_b00;
  for (uVar13 = 0x20; (uVar13 & 0xffffffc0) == 0; uVar13 = uVar13 + 0x10) {
    uVar16 = uVar13;
    for (lVar14 = 0; lVar14 != 0x80; lVar14 = lVar14 + 0x20) {
      auVar4 = vpaddd_avx2(*(undefined1 (*) [32])(local_860 + (uVar16 ^ 7) * 4),
                           *(undefined1 (*) [32])(puVar10 + lVar14));
      auVar7 = vpsubd_avx2(*(undefined1 (*) [32])(puVar10 + lVar14),
                           *(undefined1 (*) [32])(local_860 + (uVar16 ^ 7) * 4));
      auVar4 = vpmaxsd_avx2(auVar4,auVar6);
      auVar5 = vpminsd_avx2(auVar4,auVar3);
      auVar4 = vpmaxsd_avx2(auVar7,auVar6);
      auVar4 = vpminsd_avx2(auVar4,auVar3);
      *(undefined1 (*) [32])(puVar10 + lVar14) = auVar5;
      *(undefined1 (*) [32])(local_860 + (uVar16 ^ 7) * 4) = auVar4;
      auVar4 = vpaddd_avx2(*(undefined1 (*) [32])(local_860 + (uVar16 ^ 8) * 4),
                           *(undefined1 (*) [32])(local_860 + (uVar16 ^ 0xf) * 4));
      auVar7 = vpsubd_avx2(*(undefined1 (*) [32])(local_860 + (uVar16 ^ 0xf) * 4),
                           *(undefined1 (*) [32])(local_860 + (uVar16 ^ 8) * 4));
      auVar4 = vpmaxsd_avx2(auVar4,auVar6);
      auVar5 = vpminsd_avx2(auVar4,auVar3);
      auVar4 = vpmaxsd_avx2(auVar7,auVar6);
      auVar4 = vpminsd_avx2(auVar4,auVar3);
      *(undefined1 (*) [32])(local_860 + (uVar16 ^ 0xf) * 4) = auVar5;
      *(undefined1 (*) [32])(local_860 + (uVar16 ^ 8) * 4) = auVar4;
      uVar16 = uVar16 + 1;
    }
    puVar10 = puVar10 + 0x200;
  }
  local_780 = local_860[0];
  lStack_778 = local_860[1];
  lStack_770 = local_860[2];
  lStack_768 = local_860[3];
  local_7a0 = local_840[0];
  lStack_798 = local_840[1];
  lStack_790 = local_840[2];
  lStack_788 = local_840[3];
  local_7c0 = local_820[0];
  lStack_7b8 = local_820[1];
  lStack_7b0 = local_820[2];
  lStack_7a8 = local_820[3];
  local_7e0 = local_800[0];
  lStack_7d8 = local_800[1];
  lStack_7d0 = local_800[2];
  lStack_7c8 = local_800[3];
  iStack_c7c = local_c80;
  iStack_c78 = local_c80;
  iStack_c74 = local_c80;
  iStack_c70 = local_c80;
  iStack_c6c = local_c80;
  iStack_c68 = local_c80;
  iStack_c64 = local_c80;
  iStack_b9c = local_ba0;
  iStack_b98 = local_ba0;
  iStack_b94 = local_ba0;
  iStack_b90 = local_ba0;
  iStack_b8c = local_ba0;
  iStack_b88 = local_ba0;
  iStack_b84 = local_ba0;
  iStack_b7c = local_b80;
  iStack_b78 = local_b80;
  iStack_b74 = local_b80;
  iStack_b70 = local_b80;
  iStack_b6c = local_b80;
  iStack_b68 = local_b80;
  iStack_b64 = local_b80;
  iStack_b5c = local_b60;
  iStack_b58 = local_b60;
  iStack_b54 = local_b60;
  iStack_b50 = local_b60;
  iStack_b4c = local_b60;
  iStack_b48 = local_b60;
  iStack_b44 = local_b60;
  iStack_b3c = local_b40;
  iStack_b38 = local_b40;
  iStack_b34 = local_b40;
  iStack_b30 = local_b40;
  iStack_b2c = local_b40;
  iStack_b28 = local_b40;
  iStack_b24 = local_b40;
  iStack_b1c = local_b20;
  iStack_b18 = local_b20;
  iStack_b14 = local_b20;
  iStack_b10 = local_b20;
  iStack_b0c = local_b20;
  iStack_b08 = local_b20;
  iStack_b04 = local_b20;
  iStack_afc = local_b00;
  iStack_af8 = local_b00;
  iStack_af4 = local_b00;
  iStack_af0 = local_b00;
  iStack_aec = local_b00;
  iStack_ae8 = local_b00;
  iStack_ae4 = local_b00;
  iStack_adc = local_ae0;
  iStack_ad8 = local_ae0;
  iStack_ad4 = local_ae0;
  iStack_ad0 = local_ae0;
  iStack_acc = local_ae0;
  iStack_ac8 = local_ae0;
  iStack_ac4 = local_ae0;
  iStack_abc = local_ac0;
  iStack_ab8 = local_ac0;
  iStack_ab4 = local_ac0;
  iStack_ab0 = local_ac0;
  iStack_aac = local_ac0;
  iStack_aa8 = local_ac0;
  iStack_aa4 = local_ac0;
  idct64_stage8_avx2(&local_860,(__m256i *)&local_ba0,(__m256i *)&local_c80,(__m256i *)&local_b60,
                     (__m256i *)&local_b40,(__m256i *)&local_b20,(__m256i *)&local_b80,
                     (__m256i *)&local_ae0,(__m256i *)&local_b00,(__m256i *)&local_ac0,bit);
  idct64_stage9_avx2(&local_860,(__m256i *)&local_ba0,(__m256i *)&local_c80,(__m256i *)&local_ae0,
                     (__m256i *)&local_b00,(__m256i *)&local_ac0,bit);
  idct64_stage10_avx2(&local_860,(__m256i *)&local_ba0,(__m256i *)&local_c80,(__m256i *)&local_ae0,
                      (__m256i *)&local_b00,(__m256i *)&local_ac0,bit);
  idct64_stage11_avx2(&local_860,out,do_cols,bd,out_shift,(__m256i *)&local_ae0,
                      (__m256i *)&local_b00);
  return;
}

Assistant:

static void idct64_low8_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));
  const __m256i cospi_m04_p60 = pair_set_w16_epi16(-cospi[4], cospi[60]);
  const __m256i cospi_p60_p04 = pair_set_w16_epi16(cospi[60], cospi[4]);
  const __m256i cospi_m36_p28 = pair_set_w16_epi16(-cospi[36], cospi[28]);
  const __m256i cospi_m28_m36 = pair_set_w16_epi16(-cospi[28], -cospi[36]);
  const __m256i cospi_m20_p44 = pair_set_w16_epi16(-cospi[20], cospi[44]);
  const __m256i cospi_p44_p20 = pair_set_w16_epi16(cospi[44], cospi[20]);
  const __m256i cospi_m52_p12 = pair_set_w16_epi16(-cospi[52], cospi[12]);
  const __m256i cospi_m12_m52 = pair_set_w16_epi16(-cospi[12], -cospi[52]);
  const __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  const __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  const __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);
  const __m256i cospi_m24_m40 = pair_set_w16_epi16(-cospi[24], -cospi[40]);
  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m256i x[64];
  x[0] = input[0];
  x[8] = input[4];
  x[16] = input[2];
  x[24] = input[6];
  x[32] = input[1];
  x[40] = input[5];
  x[48] = input[3];
  x[56] = input[7];

  // stage 2
  btf_16_w16_0_avx2(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_w16_0_avx2(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_w16_0_avx2(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_w16_0_avx2(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[38] = x[39];
  x[41] = x[40];
  x[46] = x[47];
  x[49] = x[48];
  x[54] = x[55];
  x[57] = x[56];
  x[62] = x[63];

  // stage 4
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  x[17] = x[16];
  x[22] = x[23];
  x[25] = x[24];
  x[30] = x[31];
  btf_16_w16_avx2(cospi_m04_p60, cospi_p60_p04, &x[33], &x[62], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m28_m36, cospi_m36_p28, &x[38], &x[57], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m20_p44, cospi_p44_p20, &x[41], &x[54], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m12_m52, cospi_m52_p12, &x[46], &x[49], _r,
                  INV_COS_BIT);

  // stage 5
  x[9] = x[8];
  x[14] = x[15];
  btf_16_w16_avx2(cospi_m08_p56, cospi_p56_p08, &x[17], &x[30], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m24_m40, cospi_m40_p24, &x[22], &x[25], _r,
                  INV_COS_BIT);
  x[35] = x[32];
  x[34] = x[33];
  x[36] = x[39];
  x[37] = x[38];
  x[43] = x[40];
  x[42] = x[41];
  x[44] = x[47];
  x[45] = x[46];
  x[51] = x[48];
  x[50] = x[49];
  x[52] = x[55];
  x[53] = x[54];
  x[59] = x[56];
  x[58] = x[57];
  x[60] = x[63];
  x[61] = x[62];

  // stage 6
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[9], &x[14], _r, INV_COS_BIT);
  x[19] = x[16];
  x[18] = x[17];
  x[20] = x[23];
  x[21] = x[22];
  x[27] = x[24];
  x[26] = x[25];
  x[28] = x[31];
  x[29] = x[30];
  idct64_stage6_high32_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  x[11] = x[8];
  x[10] = x[9];
  x[12] = x[15];
  x[13] = x[14];
  idct64_stage7_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 8
  x[7] = x[0];
  x[6] = x[1];
  x[5] = x[2];
  x[4] = x[3];
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r,
                  INV_COS_BIT);
  idct64_stage8_high48_avx2(x, cospi, _r, INV_COS_BIT);

  idct64_stage9_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage10_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage11_avx2(output, x);
}